

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

shared_ptr<Buffer> __thiscall
qpdf::Stream::getStreamData(Stream *this,qpdf_stream_decode_level_e decode_level)

{
  QPDFExc *this_00;
  element_type *peVar1;
  QPDF *this_01;
  qpdf_offset_t offset;
  qpdf_stream_decode_level_e in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  __shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  shared_ptr<Buffer> sVar2;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  bool local_59;
  undefined1 local_58 [7];
  bool filtered;
  Pl_Buffer buf;
  qpdf_stream_decode_level_e decode_level_local;
  Stream *this_local;
  
  this_02 = (__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            CONCAT44(in_register_00000034,decode_level);
  buf.m._M_t.super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>.
  _M_t.super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
  super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl._4_4_ = in_EDX;
  Pl_Buffer::Pl_Buffer((Pl_Buffer *)local_58,"stream data buffer",(Pipeline *)0x0);
  pipeStreamData((Stream *)this_02,(Pipeline *)local_58,&local_59,0,
                 buf.m._M_t.
                 super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                 .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl._4_4_,false,false)
  ;
  if ((local_59 & 1U) == 0) {
    this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
    peVar1 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_02);
    this_01 = QPDFObject::getQPDF(peVar1);
    QPDF::getFilename_abi_cxx11_(&local_90,this_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
    peVar1 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_02);
    offset = QPDFObject::getParsedOffset(peVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"getStreamData called on unfilterable stream",&local_d9);
    QPDFExc::QPDFExc(this_00,qpdf_e_unsupported,&local_90,&local_b0,offset,&local_d8);
    __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  QTC::TC("qpdf","QPDF_Stream getStreamData",0);
  Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)this);
  Pl_Buffer::~Pl_Buffer((Pl_Buffer *)local_58);
  sVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Buffer>)sVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Buffer>
Stream::getStreamData(qpdf_stream_decode_level_e decode_level)
{
    Pl_Buffer buf("stream data buffer");
    bool filtered;
    pipeStreamData(&buf, &filtered, 0, decode_level, false, false);
    if (!filtered) {
        throw QPDFExc(
            qpdf_e_unsupported,
            obj->getQPDF()->getFilename(),
            "",
            obj->getParsedOffset(),
            "getStreamData called on unfilterable stream");
    }
    QTC::TC("qpdf", "QPDF_Stream getStreamData");
    return buf.getBufferSharedPointer();
}